

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O3

void __thiscall
lf::fe::HierarchicScalarFESpace<double>::Init<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&>
          (HierarchicScalarFESpace<double> *this,AllCodimMeshDataSet<unsigned_int> *degree_functor)

{
  uint interior_degree;
  element_type *peVar1;
  Entity *pEVar2;
  span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient;
  span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
  *pvVar6;
  undefined4 extraout_var_00;
  uint *puVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  runtime_error *this_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  long lVar8;
  array<unsigned_int,_3UL> edge_degrees;
  array<unsigned_int,_4UL> edge_degrees_00;
  FeHierarchicSegment<double> fe;
  string local_238;
  string local_218;
  string local_1f8;
  pointer local_1d8;
  pointer local_1c8;
  undefined1 local_1b8 [16];
  QuadRule *local_1a8;
  
  peVar1 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar3 = (*peVar1->_vptr_Mesh[2])(peVar1,2);
  if (extraout_RDX != 0) {
    lVar8 = 0;
    do {
      local_1b8._0_8_ = &PTR__ScalarReferenceFiniteElement_004b8498;
      local_1b8._8_4_ = 1;
      pvVar6 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
                *)mesh::utils::
                  AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                  ::operator()(&this->ref_el_,*(Entity **)(CONCAT44(extraout_var,iVar3) + lVar8));
      std::
      variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
      ::operator=(pvVar6,(FePoint<double> *)local_1b8);
      lVar8 = lVar8 + 8;
    } while (extraout_RDX << 3 != lVar8);
  }
  peVar1 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar3 = (*peVar1->_vptr_Mesh[2])(peVar1,1);
  if (extraout_RDX_00 != 0) {
    lVar8 = 0;
    do {
      pEVar2 = *(Entity **)(CONCAT44(extraout_var_00,iVar3) + lVar8);
      puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()(degree_functor,pEVar2);
      local_1b8._8_4_ = *puVar7;
      local_1b8._0_8_ = &PTR__ScalarReferenceFiniteElement_004b8530;
      local_1a8 = quad::QuadRuleCache::Get(&this->qr_cache_,(RefEl)0x2,local_1b8._8_4_ * 2 - 2);
      pvVar6 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
                *)mesh::utils::
                  AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                  ::operator()(&this->ref_el_,pEVar2);
      std::
      variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
      ::operator=(pvVar6,(FeHierarchicSegment<double> *)local_1b8);
      lVar8 = lVar8 + 8;
    } while (extraout_RDX_00 << 3 != lVar8);
  }
  peVar1 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar3 = (*peVar1->_vptr_Mesh[2])(peVar1,0);
  if (extraout_RDX_01 != 0) {
    lVar8 = 0;
    do {
      pEVar2 = *(Entity **)(CONCAT44(extraout_var_01,iVar3) + lVar8);
      uVar4 = (*pEVar2->_vptr_Entity[4])(pEVar2);
      if ((char)uVar4 == '\x04') {
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)CONCAT44(extraout_var_06,iVar5));
        uVar4 = *puVar7;
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)(CONCAT44(extraout_var_07,iVar5) + 8));
        edge_degrees_00._M_elems[1] = *puVar7;
        edge_degrees_00._M_elems[0] = uVar4;
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)(CONCAT44(extraout_var_08,iVar5) + 0x10));
        uVar4 = *puVar7;
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)(CONCAT44(extraout_var_09,iVar5) + 0x18));
        edge_degrees_00._M_elems[3] = *puVar7;
        edge_degrees_00._M_elems[2] = uVar4;
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()(degree_functor,pEVar2);
        uVar4 = *puVar7;
        iVar5 = (*pEVar2->_vptr_Entity[2])(pEVar2);
        local_1d8 = (pointer)CONCAT44(extraout_var_10,iVar5);
        rel_orient_00._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
        rel_orient_00._M_ptr = local_1d8;
        FeHierarchicQuad<double>::FeHierarchicQuad
                  ((FeHierarchicQuad<double> *)local_1b8,uVar4,edge_degrees_00,&this->qr_cache_,
                   rel_orient_00);
        pvVar6 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
                  *)mesh::utils::
                    AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                    ::operator()(&this->ref_el_,pEVar2);
        std::
        variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
        ::operator=(pvVar6,(FeHierarchicQuad<double> *)local_1b8);
      }
      else {
        if ((uVar4 & 0xff) != 3) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Illegal entity type",0x13);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"false","");
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_scalar_fe_space.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed(&local_218,&local_238,0xd9,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"this code should not be reached");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)CONCAT44(extraout_var_02,iVar5));
        uVar4 = *puVar7;
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)(CONCAT44(extraout_var_03,iVar5) + 8));
        edge_degrees._M_elems[1] = *puVar7;
        edge_degrees._M_elems[0] = uVar4;
        iVar5 = (*pEVar2->_vptr_Entity[1])(pEVar2,1);
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                           (degree_functor,*(Entity **)(CONCAT44(extraout_var_04,iVar5) + 0x10));
        uVar4 = *puVar7;
        puVar7 = mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()(degree_functor,pEVar2);
        interior_degree = *puVar7;
        iVar5 = (*pEVar2->_vptr_Entity[2])(pEVar2);
        local_1c8 = (pointer)CONCAT44(extraout_var_05,iVar5);
        rel_orient._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
        rel_orient._M_ptr = local_1c8;
        edge_degrees._M_elems[2] = uVar4;
        FeHierarchicTria<double>::FeHierarchicTria
                  ((FeHierarchicTria<double> *)local_1b8,interior_degree,edge_degrees,
                   &this->qr_cache_,rel_orient);
        pvVar6 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
                  *)mesh::utils::
                    AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                    ::operator()(&this->ref_el_,pEVar2);
        std::
        variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
        ::operator=(pvVar6,(FeHierarchicTria<double> *)local_1b8);
      }
      lVar8 = lVar8 + 8;
    } while (extraout_RDX_01 << 3 != lVar8);
  }
  return;
}

Assistant:

void Init(F &&degree_functor) {
    // Initialize all shape function layouts for nodes
    const size_type num_rsf_node = 1;
    for (const auto *entity : mesh_p_->Entities(2)) {
      ref_el_(*entity) = FePoint<SCALAR>(1);
    }
    // Initialize all shape function layouts for the edges
    for (const auto *entity : mesh_p_->Entities(1)) {
      FeHierarchicSegment<SCALAR> fe(degree_functor(*entity), qr_cache_);

      ref_el_(*entity) = std::move(fe);
    }
    // Initialize all shape function layouts for the cells
    for (const auto *entity : mesh_p_->Entities(0)) {
      switch (entity->RefEl()) {
        case lf::base::RefEl::kTria(): {
          const std::array<unsigned, 3> edge_degrees{
              {degree_functor(*entity->SubEntities(1)[0]),
               degree_functor(*entity->SubEntities(1)[1]),
               degree_functor(*entity->SubEntities(1)[2])}};
          FeHierarchicTria<SCALAR> fe(degree_functor(*entity), edge_degrees,
                                      qr_cache_,
                                      entity->RelativeOrientations());
          ref_el_(*entity) = std::move(fe);
          break;
        }
        case lf::base::RefEl::kQuad(): {
          const std::array<unsigned, 4> edge_degrees{
              {degree_functor(*entity->SubEntities(1)[0]),
               degree_functor(*entity->SubEntities(1)[1]),
               degree_functor(*entity->SubEntities(1)[2]),
               degree_functor(*entity->SubEntities(1)[3])}};
          FeHierarchicQuad<SCALAR> fe(degree_functor(*entity), edge_degrees,
                                      qr_cache_,
                                      entity->RelativeOrientations());
          ref_el_(*entity) = std::move(fe);
          break;
        }
        default:
          LF_VERIFY_MSG(false, "Illegal entity type");
      }
    }
  }